

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O3

void __thiscall
test_vector_dense_vector_subtraction_Test::TestBody(test_vector_dense_vector_subtraction_Test *this)

{
  element_type *peVar1;
  pointer pdVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  double *element;
  pointer pdVar6;
  long lVar7;
  undefined1 auVar8 [8];
  char *pcVar9;
  DeathTest *gtest_dt;
  Vector_Dense<double,_0UL> dynamic_vector_2;
  Vector_Dense<double,_2UL> static_vector_2;
  Vector_Dense<double,_0UL> dynamic_vector_0;
  Vector_Dense<double,_0UL> result_0;
  Vector_Dense<double,_0UL> dynamic_vector_1;
  Vector_Dense<double,_3UL> static_vector_0;
  Vector_Dense<double,_3UL> static_vector_1;
  Vector_Dense<double,_3UL> result_3;
  Vector_Dense<double,_3UL> result_2;
  Vector_Dense<double,_3UL> result_1;
  element_type *local_1c8;
  AssertHelper local_1c0;
  undefined1 local_1b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  double local_1a8;
  Vector_Dense<double,_0UL> local_198;
  Vector_Dense<double,_2UL> local_178;
  Vector_Dense<double,_0UL> local_168;
  type local_150;
  Vector_Dense<double,_0UL> local_138;
  Vector_Dense<double,_3UL> local_120;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_108;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c0;
  Vector_Dense<double,_3UL> local_a8;
  type local_90;
  type local_78;
  type local_60;
  type local_48;
  
  local_1b8 = (undefined1  [8])0xbff0000000000000;
  _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc000000000000000;
  local_1a8 = -3.0;
  local_138.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3;
  local_138.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_1b8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_168,(initializer_list<double> *)&local_138);
  local_1b8 = (undefined1  [8])0xbff0000000000000;
  _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc000000000000000;
  local_1a8 = -3.0;
  local_120.super_array<double,_3UL>._M_elems[1] = 1.48219693752374e-323;
  local_120.super_array<double,_3UL>._M_elems[0] = (double)local_1b8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_138,(initializer_list<double> *)&local_120);
  local_1b8 = (undefined1  [8])0xc010000000000000;
  _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc014000000000000;
  local_1a8 = -6.0;
  local_a8.super_array<double,_3UL>._M_elems[1] = 1.48219693752374e-323;
  local_a8.super_array<double,_3UL>._M_elems[0] = (double)local_1b8;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_120,(initializer_list<double> *)&local_a8);
  local_1b8 = (undefined1  [8])0xc010000000000000;
  _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc014000000000000;
  local_1a8 = -6.0;
  local_150.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (double *)0x3;
  local_150.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_1b8;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_a8,(initializer_list<double> *)&local_150);
  Disa::operator-(&local_150,&local_168,&local_138);
  Disa::operator-(&local_48,&local_120,&local_138);
  Disa::operator-(&local_60,&local_168,&local_a8);
  Disa::operator-(&local_78,&local_120,&local_a8);
  pdVar2 = local_150.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_150.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != local_150.super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pdVar6 = local_150.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)local_1b8,"element","0.0",*pdVar6,0.0);
      if (local_1b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_198);
        pcVar9 = "";
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((_Alloc_hider *)&(_Stack_1b0._M_pi)->_vptr__Sp_counted_base)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                   ,0xd5,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_198)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
        if (local_198.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          (**(code **)((long)*local_198.super_vector<double,_std::allocator<double>_>.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&_Stack_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Stack_1b0._M_pi);
      }
      pdVar6 = pdVar6 + 1;
    } while (pdVar6 != pdVar2);
  }
  lVar7 = 0;
  do {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_1b8,"element","-3.0",
               *(double *)((long)local_48.super_array<double,_3UL>._M_elems + lVar7),-3.0);
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_198);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)&(_Stack_1b0._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd6,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_198.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*local_198.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1b0._M_pi);
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  lVar7 = 0;
  do {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_1b8,"element","3.0",
               *(double *)((long)local_60.super_array<double,_3UL>._M_elems + lVar7),3.0);
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_198);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)&(_Stack_1b0._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd7,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_198.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*local_198.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1b0._M_pi);
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  lVar7 = 0;
  do {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_1b8,"element","0.0",
               *(double *)((long)local_78.super_array<double,_3UL>._M_elems + lVar7),0.0);
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_198);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)&(_Stack_1b0._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd8,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
      if (local_198.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*local_198.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1b0._M_pi);
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  local_198.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_198.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_198.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_178.super_array<double,_2UL>._M_elems[0] = 0.0;
  local_178.super_array<double,_2UL>._M_elems[1] = 0.0;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_1c0.data_ = (AssertHelperData *)0x147265;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1b8,
               (testing *)&local_1c0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c0,(PolymorphicMatcher *)local_1b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("dynamic_vector_0 - dynamic_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdc,(DeathTest **)&local_1c8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c0);
    auVar8 = (undefined1  [8])local_1c8;
    if (!bVar3) goto LAB_00110df9;
    if (local_1c8 != (element_type *)0x0) {
      iVar5 = (**(code **)(local_1c8->pattern_ + 0x10))(local_1c8);
      peVar1 = local_1c8;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(local_1c8->pattern_ + 0x18))(local_1c8);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(peVar1->pattern_ + 0x20))(peVar1,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
          goto LAB_00110df9;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          Disa::operator-(&local_90,&local_168,&local_198);
          if (local_90.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            operator_delete(local_90.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.super_vector<double,_std::allocator<double>_>.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.super_vector<double,_std::allocator<double>_>.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        (**(code **)(local_1c8->pattern_ + 0x28))(local_1c8,2);
        (**(code **)(peVar1->pattern_ + 0x28))(peVar1,0);
      }
      pcVar9 = ((element_type *)auVar8)->pattern_;
      goto LAB_00110e4c;
    }
  }
  else {
LAB_00110df9:
    testing::Message::Message((Message *)local_1b8);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdc,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8 != (undefined1  [8])0x0) {
      pcVar9 = *(char **)local_1b8;
      auVar8 = local_1b8;
LAB_00110e4c:
      (**(code **)(pcVar9 + 8))(auVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_1c0.data_ = (AssertHelperData *)0x147265;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1b8,
               (testing *)&local_1c0,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_d8,(PolymorphicMatcher *)local_1b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("static_vector_0 - dynamic_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdd,(DeathTest **)&local_1c8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_d8);
    auVar8 = (undefined1  [8])local_1c8;
    if (!bVar3) goto LAB_00110f64;
    if (local_1c8 != (element_type *)0x0) {
      iVar5 = (**(code **)(local_1c8->pattern_ + 0x10))(local_1c8);
      peVar1 = local_1c8;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(local_1c8->pattern_ + 0x18))(local_1c8);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(peVar1->pattern_ + 0x20))(peVar1,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
          goto LAB_00110f64;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          Disa::operator-((type *)local_1b8,&local_120,&local_198);
        }
        (**(code **)(local_1c8->pattern_ + 0x28))(local_1c8,2);
        (**(code **)(peVar1->pattern_ + 0x28))(peVar1,0);
      }
      pcVar9 = ((element_type *)auVar8)->pattern_;
      goto LAB_00110fb7;
    }
  }
  else {
LAB_00110f64:
    testing::Message::Message((Message *)local_1b8);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdd,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8 != (undefined1  [8])0x0) {
      pcVar9 = *(char **)local_1b8;
      auVar8 = local_1b8;
LAB_00110fb7:
      (**(code **)(pcVar9 + 8))(auVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_1c0.data_ = (AssertHelperData *)0x147265;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1b8,
               (testing *)&local_1c0,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_f0,(PolymorphicMatcher *)local_1b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("dynamic_vector_0 - static_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xde,(DeathTest **)&local_1c8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_f0);
    auVar8 = (undefined1  [8])local_1c8;
    if (!bVar3) goto LAB_001110c7;
    if (local_1c8 != (element_type *)0x0) {
      iVar5 = (**(code **)(local_1c8->pattern_ + 0x10))(local_1c8);
      peVar1 = local_1c8;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(local_1c8->pattern_ + 0x18))(local_1c8);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(peVar1->pattern_ + 0x20))(peVar1,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
          goto LAB_001110c7;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          Disa::operator-(&local_168,&local_178);
        }
        (**(code **)(local_1c8->pattern_ + 0x28))(local_1c8,2);
        (**(code **)(peVar1->pattern_ + 0x28))(peVar1,0);
      }
      pcVar9 = ((element_type *)auVar8)->pattern_;
      goto LAB_0011111a;
    }
  }
  else {
LAB_001110c7:
    testing::Message::Message((Message *)local_1b8);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xde,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8 != (undefined1  [8])0x0) {
      pcVar9 = *(char **)local_1b8;
      auVar8 = local_1b8;
LAB_0011111a:
      (**(code **)(pcVar9 + 8))(auVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_1c0.data_ = (AssertHelperData *)0x147265;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1b8,
               (testing *)&local_1c0,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_108,(PolymorphicMatcher *)local_1b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1b0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("static_vector_0 - static_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_108,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdf,(DeathTest **)&local_1c8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_108);
    auVar8 = (undefined1  [8])local_1c8;
    if (!bVar3) goto LAB_00111232;
    if (local_1c8 == (element_type *)0x0) goto LAB_00111288;
    iVar5 = (**(code **)(local_1c8->pattern_ + 0x10))(local_1c8);
    peVar1 = local_1c8;
    if (iVar5 == 0) {
      iVar5 = (**(code **)(local_1c8->pattern_ + 0x18))(local_1c8);
      bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
      cVar4 = (**(code **)(local_1c8->pattern_ + 0x20))(local_1c8,bVar3);
      if (cVar4 == '\0') {
        (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
        goto LAB_00111232;
      }
    }
    else if (iVar5 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        Disa::operator-((type *)local_1b8,&local_120,&local_178);
      }
      (**(code **)(local_1c8->pattern_ + 0x28))(local_1c8,2);
      (**(code **)(peVar1->pattern_ + 0x28))(peVar1,0);
    }
    pcVar9 = ((element_type *)auVar8)->pattern_;
  }
  else {
LAB_00111232:
    testing::Message::Message((Message *)local_1b8);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdf,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8 == (undefined1  [8])0x0) goto LAB_00111288;
    pcVar9 = *(char **)local_1b8;
    auVar8 = local_1b8;
  }
  (**(code **)(pcVar9 + 8))(auVar8);
LAB_00111288:
  if (local_198.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_198.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (double *)0x0) {
    operator_delete(local_150.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (double *)0x0) {
    operator_delete(local_138.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_168.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(test_vector_dense, vector_subtraction) {
  Vector_Dense<Scalar, 0> dynamic_vector_0 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 0> dynamic_vector_1 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 3> static_vector_0 = {-4.0, -5.0, -6.0};
  Vector_Dense<Scalar, 3> static_vector_1 = {-4.0, -5.0, -6.0};

  Vector_Dense<Scalar, 0> result_0 = dynamic_vector_0 - dynamic_vector_1;
  Vector_Dense<Scalar, 3> result_1 = static_vector_0 - dynamic_vector_1;
  Vector_Dense<Scalar, 3> result_2 = dynamic_vector_0 - static_vector_1;
  Vector_Dense<Scalar, 3> result_3 = static_vector_0 - static_vector_1;
  FOR_EACH(element, result_0) EXPECT_DOUBLE_EQ(element, 0.0);
  FOR_EACH(element, result_1) EXPECT_DOUBLE_EQ(element, -3.0);
  FOR_EACH(element, result_2) EXPECT_DOUBLE_EQ(element, 3.0);
  FOR_EACH(element, result_3) EXPECT_DOUBLE_EQ(element, 0.0);

  Vector_Dense<Scalar, 0> dynamic_vector_2;
  Vector_Dense<Scalar, 2> static_vector_2;
  EXPECT_DEATH(dynamic_vector_0 - dynamic_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 - dynamic_vector_2, "./*");
  EXPECT_DEATH(dynamic_vector_0 - static_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 - static_vector_2, "./*");
}